

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_functions.c
# Opt level: O0

void WebRtcIsac_AllZeroFilter(double *In,double *Coef,size_t lengthInOut,int orderCoef,double *Out)

{
  double local_48;
  double tmp;
  ulong uStack_38;
  int k;
  size_t n;
  double *Out_local;
  int orderCoef_local;
  size_t lengthInOut_local;
  double *Coef_local;
  double *In_local;
  
  n = (size_t)Out;
  Coef_local = In;
  for (uStack_38 = 0; uStack_38 < lengthInOut; uStack_38 = uStack_38 + 1) {
    local_48 = *Coef_local * *Coef;
    for (tmp._4_4_ = 1; tmp._4_4_ <= orderCoef; tmp._4_4_ = tmp._4_4_ + 1) {
      local_48 = Coef[tmp._4_4_] * Coef_local[-tmp._4_4_] + local_48;
    }
    *(double *)n = local_48;
    Coef_local = Coef_local + 1;
    n = n + 8;
  }
  return;
}

Assistant:

void WebRtcIsac_AllZeroFilter(double* In,
                              double* Coef,
                              size_t lengthInOut,
                              int orderCoef,
                              double* Out) {
  /* the state of filter is assumed to be in In[-1] to In[-orderCoef] */

  size_t n;
  int k;
  double tmp;

  for(n = 0; n < lengthInOut; n++)
  {
    tmp = In[0] * Coef[0];

    for(k = 1; k <= orderCoef; k++){
      tmp += Coef[k] * In[-k];
    }

    *Out++ = tmp;
    In++;
  }
}